

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixmapfilter.cpp
# Opt level: O0

void __thiscall
QPixmapDropShadowFilter::draw
          (QPixmapDropShadowFilter *this,QPainter *p,QPointF *pos,QPixmap *px,QRectF *src)

{
  QPixmapDropShadowFilterPrivate *pQVar1;
  ulong uVar2;
  QPainter *this_00;
  QImage *in_RCX;
  QRectF *in_RDX;
  QPixmap *in_RSI;
  QPointF *in_RDI;
  QImage *in_R8;
  long in_FS_OFFSET;
  double dVar3;
  QPixmapDropShadowFilterPrivate *d;
  QPainter blurPainter;
  QImage blurred;
  QPainter tmpPainter;
  QImage tmp;
  undefined1 *local_58;
  undefined8 local_50;
  undefined1 *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  undefined1 *local_30;
  undefined8 local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = d_func((QPixmapDropShadowFilter *)0x4ade7f);
  uVar2 = QPixmap::isNull();
  if ((uVar2 & 1) == 0) {
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    local_28 = QPixmap::size();
    QImage::QImage((QImage *)&local_20,(QSize *)&local_28,Format_ARGB32_Premultiplied);
    dVar3 = (double)QPixmap::devicePixelRatio();
    QImage::setDevicePixelRatio(dVar3);
    QImage::fill((uint)&local_20);
    local_30 = &DAT_aaaaaaaaaaaaaaaa;
    QPainter::QPainter((QPainter *)&local_30,(QPaintDevice *)&local_20);
    QPainter::setCompositionMode((CompositionMode)&local_30);
    QPainter::drawPixmap((QPointF *)&local_30,(QPixmap *)&pQVar1->offset);
    QPainter::end();
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    local_40 = &DAT_aaaaaaaaaaaaaaaa;
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    local_50 = QImage::size();
    QImage::QImage((QImage *)&local_48,(QSize *)&local_50,Format_ARGB32_Premultiplied);
    dVar3 = (double)QPixmap::devicePixelRatio();
    QImage::setDevicePixelRatio(dVar3);
    QImage::fill((uint)&local_48);
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    QPainter::QPainter((QPainter *)&local_58,(QPaintDevice *)&local_48);
    qt_blurImage((QPainter *)&local_58,(QImage *)&local_20,pQVar1->radius,false,true,0);
    QPainter::end();
    QImage::operator=(in_RCX,in_R8);
    QPainter::begin((QPaintDevice *)&local_30);
    QPainter::setCompositionMode((CompositionMode)&local_30);
    this_00 = (QPainter *)QImage::rect();
    QPainter::fillRect((QRect *)&local_30,(QColor *)&stack0xffffffffffffff98);
    QPainter::end();
    QPainter::drawImage((QPointF *)in_RSI,(QImage *)in_RDX);
    QPainter::drawPixmap(this_00,in_RDI,in_RSI,in_RDX);
    QPainter::~QPainter((QPainter *)&local_58);
    QImage::~QImage((QImage *)&local_48);
    QPainter::~QPainter((QPainter *)&local_30);
    QImage::~QImage((QImage *)&local_20);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QPixmapDropShadowFilter::draw(QPainter *p,
                                   const QPointF &pos,
                                   const QPixmap &px,
                                   const QRectF &src) const
{
    Q_D(const QPixmapDropShadowFilter);

    if (px.isNull())
        return;

    QImage tmp(px.size(), QImage::Format_ARGB32_Premultiplied);
    tmp.setDevicePixelRatio(px.devicePixelRatio());
    tmp.fill(0);
    QPainter tmpPainter(&tmp);
    tmpPainter.setCompositionMode(QPainter::CompositionMode_Source);
    tmpPainter.drawPixmap(d->offset, px);
    tmpPainter.end();

    // blur the alpha channel
    QImage blurred(tmp.size(), QImage::Format_ARGB32_Premultiplied);
    blurred.setDevicePixelRatio(px.devicePixelRatio());
    blurred.fill(0);
    QPainter blurPainter(&blurred);
    qt_blurImage(&blurPainter, tmp, d->radius, false, true);
    blurPainter.end();

    tmp = std::move(blurred);

    // blacken the image...
    tmpPainter.begin(&tmp);
    tmpPainter.setCompositionMode(QPainter::CompositionMode_SourceIn);
    tmpPainter.fillRect(tmp.rect(), d->color);
    tmpPainter.end();

    // draw the blurred drop shadow...
    p->drawImage(pos, tmp);

    // Draw the actual pixmap...
    p->drawPixmap(pos, px, src);
}